

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O2

TestFactoryRegistryList * CppUnit::TestFactoryRegistryList::getInstance(void)

{
  int iVar1;
  
  if (getInstance()::list == '\0') {
    iVar1 = __cxa_guard_acquire(&getInstance()::list);
    if (iVar1 != 0) {
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      getInstance::list.m_registries._M_t._M_impl._0_8_ = 0;
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header;
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_header;
      getInstance::list.m_registries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      stateFlag(CppUnit::TestFactoryRegistryList::State)::state = 2;
      __cxa_atexit(~TestFactoryRegistryList,&getInstance::list,&__dso_handle);
      __cxa_guard_release(&getInstance()::list);
    }
  }
  return &getInstance::list;
}

Assistant:

static TestFactoryRegistryList *getInstance()
  {
    static TestFactoryRegistryList list;
    return &list;
  }